

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

fct_logger_i * fckern_sel_log(fct_logger_types_t *search,char *sel_logger)

{
  int iVar1;
  fct_logger_new_fn *pp_Var2;
  fct_logger_i *pfVar3;
  
  if (*sel_logger == '\0') {
    __assert_fail("strlen(sel_logger) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x81d
                  ,"fct_logger_i *fckern_sel_log(fct_logger_types_t *, const char *)");
  }
  pp_Var2 = &search->logger_new_fn;
  while( true ) {
    if (((fct_logger_types_t *)(pp_Var2 + -1))->name == (char *)0x0) {
      return (fct_logger_i *)0x0;
    }
    iVar1 = fctstr_ieq(((fct_logger_types_t *)(pp_Var2 + -1))->name,sel_logger);
    if (iVar1 != 0) break;
    pp_Var2 = pp_Var2 + 3;
  }
  pfVar3 = (**pp_Var2)();
  return pfVar3;
}

Assistant:

static fct_logger_i*
fckern_sel_log(fct_logger_types_t *search, char const *sel_logger)
{
    fct_logger_types_t *iter;
    FCT_ASSERT(search != NULL);
    FCT_ASSERT(sel_logger != NULL);
    FCT_ASSERT(strlen(sel_logger) > 0);
    for ( iter = search; iter->name != NULL; ++iter)
    {
        if ( fctstr_ieq(iter->name, sel_logger) )
        {
            return iter->logger_new_fn();
        }
    }
    return NULL;
}